

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_send_creq(udp_ep *ep,udp_pipe *p)

{
  nni_time nVar1;
  undefined1 local_2c [8];
  udp_sp_creq creq;
  udp_pipe *p_local;
  udp_ep *ep_local;
  
  local_2c[0] = '\x01';
  local_2c[1] = '\x01';
  local_2c._2_2_ = p->proto;
  local_2c._4_4_ = p->self_id;
  creq._0_4_ = p->peer_id;
  creq.us_sender_id = p->self_seq;
  p->self_seq = creq.us_sender_id + 1;
  creq.us_peer_id._0_2_ = p->rcvmax;
  creq.us_peer_id._3_1_ = (undefined1)((p->refresh + 999) / 1000);
  creq._12_8_ = p;
  nVar1 = nni_clock();
  *(nni_time *)(creq._12_8_ + 0xc0) = nVar1 + (long)*(int *)(creq._12_8_ + 0xb4);
  *(undefined8 *)(creq._12_8_ + 0xb8) = *(undefined8 *)(creq._12_8_ + 0xc0);
  udp_pipe_schedule((udp_pipe *)creq._12_8_);
  udp_queue_tx(ep,(nng_sockaddr *)(creq._12_8_ + 0x10),(udp_sp_msg *)local_2c,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_send_creq(udp_ep *ep, udp_pipe *p)
{
	udp_sp_creq creq;
	creq.us_ver       = 0x1;
	creq.us_op_code   = OPCODE_CREQ;
	creq.us_type      = p->proto;
	creq.us_sender_id = p->self_id;
	creq.us_peer_id   = p->peer_id;
	creq.us_sequence  = p->self_seq++;
	creq.us_recv_max  = p->rcvmax;
	creq.us_refresh   = (p->refresh + NNI_SECOND - 1) / NNI_SECOND;
	p->next_creq      = nni_clock() + UDP_PIPE_REFRESH(p);
	p->next_wake      = p->next_creq;

	udp_pipe_schedule(p);
	udp_queue_tx(ep, &p->peer_addr, (void *) &creq, NULL);
}